

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void hts_idx_finish(hts_idx_t *idx,uint64_t final_offset)

{
  int local_1c;
  int i;
  uint64_t final_offset_local;
  hts_idx_t *idx_local;
  
  if ((idx != (hts_idx_t *)0x0) && ((idx->z).finished == 0)) {
    if (-1 < (idx->z).save_tid) {
      insert_to_b(idx->bidx[(idx->z).save_tid],(idx->z).save_bin,(idx->z).save_off,final_offset);
      insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).off_beg,final_offset);
      insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).n_mapped,(idx->z).n_unmapped
                 );
    }
    for (local_1c = 0; local_1c < idx->n; local_1c = local_1c + 1) {
      update_loff(idx,local_1c,(uint)(idx->fmt == 0));
      compress_binning(idx,local_1c);
    }
    (idx->z).finished = 1;
  }
  return;
}

Assistant:

void hts_idx_finish(hts_idx_t *idx, uint64_t final_offset)
{
    int i;
    if (idx == NULL || idx->z.finished) return; // do not run this function on an empty index or multiple times
    if (idx->z.save_tid >= 0) {
        insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
    }
    for (i = 0; i < idx->n; ++i) {
        update_loff(idx, i, (idx->fmt == HTS_FMT_CSI));
        compress_binning(idx, i);
    }
    idx->z.finished = 1;
}